

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void block_variance(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h,uint *sse,
                   int *sum,int block_size,uint32_t *sse8x8,int *sum8x8,uint32_t *var8x8)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint *in_stack_00000008;
  int *in_stack_00000010;
  int col;
  int row;
  int k;
  int local_40;
  int local_3c;
  int local_38;
  
  local_38 = 0;
  *in_stack_00000008 = 0;
  *in_stack_00000010 = 0;
  for (local_3c = 0; local_3c < in_R9D; local_3c = col + local_3c) {
    for (local_40 = 0; local_40 < in_R8D; local_40 = local_40 + 0x20) {
      (*aom_get_var_sse_sum_8x8_quad)
                ((uint8_t *)(in_RDI + in_ESI * local_3c + (long)local_40),in_ESI,
                 (uint8_t *)(in_RDX + in_ECX * local_3c + (long)local_40),in_ECX,
                 (uint32_t *)(CONCAT44(h,k) + (long)local_38 * 4),
                 (int *)(CONCAT44(ref_stride,w) + (long)local_38 * 4),in_stack_00000008,
                 in_stack_00000010,(uint32_t *)(ref + (long)local_38 * 4));
      local_38 = local_38 + 4;
    }
  }
  return;
}

Assistant:

static void block_variance(const uint8_t *src, int src_stride,
                           const uint8_t *ref, int ref_stride, int w, int h,
                           unsigned int *sse, int *sum, int block_size,
                           uint32_t *sse8x8, int *sum8x8, uint32_t *var8x8) {
  int k = 0;
  *sse = 0;
  *sum = 0;

  // This function is called for block sizes >= BLOCK_32x32. As per the design
  // the aom_get_var_sse_sum_8x8_quad() processes four 8x8 blocks (in a 8x32)
  // per call. Hence the width and height of the block need to be at least 8 and
  // 32 samples respectively.
  assert(w >= 32);
  assert(h >= 8);
  for (int row = 0; row < h; row += block_size) {
    for (int col = 0; col < w; col += 32) {
      aom_get_var_sse_sum_8x8_quad(src + src_stride * row + col, src_stride,
                                   ref + ref_stride * row + col, ref_stride,
                                   &sse8x8[k], &sum8x8[k], sse, sum,
                                   &var8x8[k]);
      k += 4;
    }
  }
}